

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_setup_encoder(opj_j2k_t *j2k,opj_cparameters_t *parameters,opj_image_t *image)

{
  float *pfVar1;
  opj_poc_t *poVar2;
  opj_poc_t *poVar3;
  OPJ_CINEMA_MODE OVar4;
  int iVar5;
  int *__src;
  char *__s;
  opj_image_comp_t *poVar6;
  float *pfVar7;
  OPJ_PROG_ORDER OVar8;
  OPJ_UINT32 OVar9;
  opj_cp_t *poVar10;
  int *__dest;
  char *__dest_00;
  opj_tcp_t *poVar11;
  opj_tccp_t *poVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  int iVar20;
  OPJ_UINT32 OVar21;
  ulong uVar22;
  float *pfVar23;
  opj_tccp_t *tccp;
  OPJ_UINT32 OVar24;
  float *pfVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  float *pfVar30;
  size_t sVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  int local_78;
  int local_74;
  long local_58;
  
  if (image != (opj_image_t *)0x0 &&
      (parameters != (opj_cparameters_t *)0x0 && j2k != (opj_j2k_t *)0x0)) {
    poVar10 = (opj_cp_t *)calloc(1,0x90);
    j2k->cp = poVar10;
    poVar10->tw = 1;
    poVar10->th = 1;
    iVar20 = parameters->max_comp_size;
    poVar10->cinema = parameters->cp_cinema;
    poVar10->max_comp_size = iVar20;
    poVar10->rsiz = parameters->cp_rsiz;
    iVar20 = parameters->cp_fixed_alloc;
    poVar10->disto_alloc = parameters->cp_disto_alloc;
    poVar10->fixed_alloc = iVar20;
    poVar10->fixed_quality = parameters->cp_fixed_quality;
    __src = parameters->cp_matrice;
    if (__src != (int *)0x0) {
      sVar31 = (long)(parameters->tcp_numlayers * parameters->numresolution * 3) << 2;
      __dest = (int *)malloc(sVar31);
      poVar10->matrice = __dest;
      memcpy(__dest,__src,sVar31);
    }
    local_74 = parameters->cp_tdx;
    poVar10->tdx = local_74;
    local_78 = parameters->cp_tdy;
    poVar10->tdy = local_78;
    uVar27 = parameters->cp_tx0;
    poVar10->tx0 = uVar27;
    uVar16 = parameters->cp_ty0;
    poVar10->ty0 = uVar16;
    __s = parameters->cp_comment;
    if (__s != (char *)0x0) {
      sVar31 = strlen(__s);
      __dest_00 = (char *)malloc(sVar31 + 1);
      poVar10->comment = __dest_00;
      if (__dest_00 != (char *)0x0) {
        strcpy(__dest_00,__s);
      }
    }
    if (parameters->tile_size_on == 0) {
      poVar10->tdx = image->x1 - uVar27;
      poVar10->tdy = image->y1 - uVar16;
      local_78 = 1;
      local_74 = 1;
    }
    else {
      local_74 = (int)(image->x1 + local_74 + ~uVar27) / local_74;
      poVar10->tw = local_74;
      local_78 = (int)(~uVar16 + local_78 + image->y1) / local_78;
      poVar10->th = local_78;
    }
    if (parameters->tp_on != '\0') {
      poVar10->tp_flag = parameters->tp_flag;
      poVar10->tp_on = '\x01';
    }
    uVar33 = (ulong)image->numcomps;
    if (uVar33 != 0) {
      poVar6 = image->comps;
      lVar17 = 0;
      iVar20 = 0;
      do {
        iVar20 = iVar20 + *(int *)((long)&poVar6->h + lVar17) * *(int *)((long)&poVar6->w + lVar17)
                          * *(int *)((long)&poVar6->prec + lVar17);
        lVar17 = lVar17 + 0x38;
      } while (uVar33 * 0x38 - lVar17 != 0);
      poVar10->img_size = iVar20;
    }
    poVar11 = (opj_tcp_t *)calloc((long)(local_78 * local_74),0x15e8);
    poVar10->tcps = poVar11;
    if (0 < local_78 * local_74) {
      pfVar1 = parameters->tcp_rates;
      local_58 = 0x144c;
      uVar15 = 0;
      do {
        poVar11 = poVar10->tcps;
        iVar20 = parameters->tcp_numlayers;
        poVar11[uVar15].numlayers = iVar20;
        if (0 < (long)iVar20) {
          OVar4 = poVar10->cinema;
          iVar5 = poVar10->fixed_quality;
          pfVar25 = poVar11[uVar15].rates;
          pfVar23 = poVar11[uVar15].distoratio;
          pfVar7 = parameters->tcp_distoratio;
          if (iVar5 == 0) {
            pfVar23 = pfVar25;
            pfVar7 = pfVar1;
          }
          lVar17 = 0;
          do {
            bVar34 = OVar4 == OFF;
            pfVar19 = pfVar25;
            pfVar30 = pfVar1;
            if (bVar34) {
              pfVar19 = pfVar23;
              pfVar30 = pfVar7;
            }
            if (!bVar34 && iVar5 != 0) {
              *(float *)((long)poVar11->rates + lVar17 * 4 + local_58 + -0x14) =
                   parameters->tcp_distoratio[lVar17];
              pfVar19 = pfVar25;
              pfVar30 = pfVar1;
            }
            pfVar19[lVar17] = pfVar30[lVar17];
            lVar17 = lVar17 + 1;
          } while (iVar20 != lVar17);
        }
        OVar8 = parameters->prog_order;
        poVar11[uVar15].csty = parameters->csty;
        poVar11[uVar15].prg = OVar8;
        poVar11[uVar15].mct = (int)parameters->tcp_mct;
        poVar11[uVar15].POC = 0;
        uVar27 = parameters->numpocs;
        uVar13 = 0;
        iVar20 = 0;
        if ((ulong)uVar27 != 0) {
          poVar11[uVar15].POC = 1;
          if ((int)uVar27 < 1) {
            iVar20 = -1;
          }
          else {
            lVar17 = 0;
            iVar20 = 0;
            do {
              iVar5 = *(int *)(parameters->POC[0].progorder + lVar17 + 8);
              if (iVar5 == -1 || uVar15 == iVar5 - 1) {
                poVar2 = parameters->POC + iVar20;
                OVar21 = poVar2->compno0;
                OVar24 = poVar2->layno1;
                OVar9 = poVar2->resno1;
                poVar3 = poVar11[uVar15].pocs + iVar20;
                poVar3->resno0 = poVar2->resno0;
                poVar3->compno0 = OVar21;
                poVar3->layno1 = OVar24;
                poVar3->resno1 = OVar9;
                poVar11[uVar15].pocs[iVar20].compno1 = parameters->POC[iVar20].compno1;
                poVar11[uVar15].pocs[iVar20].prg1 = parameters->POC[iVar20].prg1;
                poVar11[uVar15].pocs[iVar20].tile = parameters->POC[iVar20].tile;
                iVar20 = iVar20 + 1;
              }
              lVar17 = lVar17 + 0x94;
            } while ((ulong)uVar27 * 0x94 - lVar17 != 0);
            iVar20 = iVar20 + -1;
          }
        }
        poVar11[uVar15].numpocs = iVar20;
        poVar12 = (opj_tccp_t *)calloc(uVar33,0x438);
        poVar11[uVar15].tccps = poVar12;
        if ((int)uVar33 != 0) {
          lVar32 = 0x3b0;
          lVar17 = 0;
          uVar33 = 0;
          do {
            poVar12 = poVar11[uVar15].tccps;
            uVar16 = parameters->csty & 1;
            poVar12[uVar33].csty = uVar16;
            uVar27 = parameters->numresolution;
            uVar13 = (ulong)uVar27;
            poVar12[uVar33].numresolutions = uVar27;
            OVar21 = 0;
            OVar24 = 0;
            if (1 < parameters->cblockw_init) {
              OVar24 = 0;
              uVar28 = parameters->cblockw_init;
              do {
                OVar24 = OVar24 + 1;
                bVar34 = 3 < uVar28;
                uVar28 = uVar28 >> 1;
              } while (bVar34);
            }
            tccp = poVar12 + uVar33;
            tccp->cblkw = OVar24;
            if (1 < parameters->cblockh_init) {
              OVar21 = 0;
              uVar28 = parameters->cblockh_init;
              do {
                OVar21 = OVar21 + 1;
                bVar34 = 3 < uVar28;
                uVar28 = uVar28 >> 1;
              } while (bVar34);
            }
            tccp->cblkh = OVar21;
            tccp->cblksty = parameters->mode;
            bVar34 = parameters->irreversible == 0;
            tccp->qmfbid = (uint)bVar34;
            tccp->qntsty = (uint)!bVar34 * 2;
            tccp->numgbits = 2;
            iVar20 = 0;
            if (uVar33 == (uint)parameters->roi_compno) {
              iVar20 = parameters->roi_shift;
            }
            tccp->roishift = iVar20;
            if (parameters->cp_cinema == OFF) {
              if (uVar16 == 0) {
                if (uVar13 != 0) {
                  uVar18 = 0;
                  do {
                    *(undefined4 *)((long)poVar12 + uVar18 * 4 + lVar32 + -0x84) = 0xf;
                    *(undefined4 *)((long)poVar12->stepsizes + uVar18 * 4 + lVar32 + -0x1c) = 0xf;
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < uVar13);
                }
              }
              else if (-1 < (int)(uVar27 - 1)) {
                uVar18 = (ulong)(uVar27 - 1);
                uVar22 = 0;
                do {
                  lVar26 = (long)parameters->res_spec;
                  if ((long)uVar22 < lVar26) {
                    uVar27 = parameters->prcw_init[uVar22];
                    OVar21 = 1;
                    OVar24 = 1;
                    if ((0 < (int)uVar27) && (OVar24 = 0, uVar27 != 1)) {
                      OVar24 = 0;
                      uVar29 = (ulong)uVar27;
                      do {
                        uVar29 = uVar29 >> 1;
                        OVar24 = OVar24 + 1;
                        bVar34 = 3 < uVar27;
                        uVar27 = (uint)uVar29;
                      } while (bVar34);
                    }
                    tccp->prcw[uVar18] = OVar24;
                    uVar27 = parameters->prch_init[uVar22];
                    if (0 < (int)uVar27) {
                      if (uVar27 == 1) {
LAB_001f26d4:
                        OVar21 = 0;
                      }
                      else {
                        OVar21 = 0;
                        do {
                          OVar21 = OVar21 + 1;
                          bVar34 = 3 < uVar27;
                          uVar27 = uVar27 >> 1;
                        } while (bVar34);
                      }
                    }
                  }
                  else {
                    bVar14 = ((char)uVar22 - (char)parameters->res_spec) + 1;
                    uVar27 = parameters->prcw_init[lVar26 + -1] >> (bVar14 & 0x1f);
                    uVar16 = parameters->prcw_init[lVar26 + 0x20] >> (bVar14 & 0x1f);
                    OVar21 = 1;
                    OVar24 = 1;
                    if ((0 < (int)uVar27) && (OVar24 = 0, uVar27 != 1)) {
                      OVar24 = 0;
                      do {
                        OVar24 = OVar24 + 1;
                        bVar34 = 3 < uVar27;
                        uVar27 = uVar27 >> 1;
                      } while (bVar34);
                    }
                    tccp->prcw[uVar18] = OVar24;
                    if (0 < (int)uVar16) {
                      if (uVar16 == 1) goto LAB_001f26d4;
                      OVar21 = 0;
                      do {
                        OVar21 = OVar21 + 1;
                        bVar34 = 3 < uVar16;
                        uVar16 = uVar16 >> 1;
                      } while (bVar34);
                    }
                  }
                  tccp->prch[uVar18] = OVar21;
                  uVar22 = uVar22 + 1;
                  uVar18 = uVar18 - 1;
                } while (uVar22 != uVar13);
              }
            }
            else {
              tccp->prcw[0] = 7;
              tccp->prch[0] = 7;
              if (1 < uVar27) {
                lVar26 = 0xcc;
                do {
                  *(undefined4 *)((long)poVar12->stepsizes + lVar26 * 4 + lVar17 + -0x1c) = 8;
                  *(undefined4 *)((long)&poVar12->stepsizes[0xd].expn + lVar26 * 4 + lVar17) = 8;
                  uVar18 = lVar26 - 0xca;
                  lVar26 = lVar26 + 1;
                } while (uVar18 < uVar13);
              }
            }
            dwt_calc_explicit_stepsizes(tccp,image->comps[uVar33].prec);
            uVar33 = uVar33 + 1;
            uVar13 = (ulong)image->numcomps;
            lVar17 = lVar17 + 0x438;
            lVar32 = lVar32 + 0x438;
          } while (uVar33 < uVar13);
          local_74 = poVar10->tw;
          local_78 = poVar10->th;
        }
        uVar15 = uVar15 + 1;
        local_58 = local_58 + 0x15e8;
        uVar33 = uVar13;
      } while ((long)uVar15 < (long)(local_78 * local_74));
    }
  }
  return;
}

Assistant:

void j2k_setup_encoder(opj_j2k_t *j2k, opj_cparameters_t *parameters, opj_image_t *image) {
	int i, j, tileno, numpocs_tile;
	opj_cp_t *cp = NULL;

	if(!j2k || !parameters || ! image) {
		return;
	}

	/* create and initialize the coding parameters structure */
	cp = (opj_cp_t*) opj_calloc(1, sizeof(opj_cp_t));

	/* keep a link to cp so that we can destroy it later in j2k_destroy_compress */
	j2k->cp = cp;

	/* set default values for cp */
	cp->tw = 1;
	cp->th = 1;

	/* 
	copy user encoding parameters 
	*/
	cp->cinema = parameters->cp_cinema;
	cp->max_comp_size =	parameters->max_comp_size;
	cp->rsiz   = parameters->cp_rsiz;
	cp->disto_alloc = parameters->cp_disto_alloc;
	cp->fixed_alloc = parameters->cp_fixed_alloc;
	cp->fixed_quality = parameters->cp_fixed_quality;

	/* mod fixed_quality */
	if(parameters->cp_matrice) {
		size_t array_size = parameters->tcp_numlayers * parameters->numresolution * 3 * sizeof(int);
		cp->matrice = (int *) opj_malloc(array_size);
		memcpy(cp->matrice, parameters->cp_matrice, array_size);
	}

	/* tiles */
	cp->tdx = parameters->cp_tdx;
	cp->tdy = parameters->cp_tdy;

	/* tile offset */
	cp->tx0 = parameters->cp_tx0;
	cp->ty0 = parameters->cp_ty0;

	/* comment string */
	if(parameters->cp_comment) {
		cp->comment = (char*)opj_malloc(strlen(parameters->cp_comment) + 1);
		if(cp->comment) {
			strcpy(cp->comment, parameters->cp_comment);
		}
	}

	/*
	calculate other encoding parameters
	*/

	if (parameters->tile_size_on) {
		cp->tw = int_ceildiv(image->x1 - cp->tx0, cp->tdx);
		cp->th = int_ceildiv(image->y1 - cp->ty0, cp->tdy);
	} else {
		cp->tdx = image->x1 - cp->tx0;
		cp->tdy = image->y1 - cp->ty0;
	}

	if(parameters->tp_on){
		cp->tp_flag = parameters->tp_flag;
		cp->tp_on = 1;
	}
	
	cp->img_size = 0;
	for(i=0;i<image->numcomps ;i++){
	cp->img_size += (image->comps[i].w *image->comps[i].h * image->comps[i].prec);
	}


#ifdef USE_JPWL
	/*
	calculate JPWL encoding parameters
	*/

	if (parameters->jpwl_epc_on) {
		int i;

		/* set JPWL on */
		cp->epc_on = OPJ_TRUE;
		cp->info_on = OPJ_FALSE; /* no informative technique */

		/* set EPB on */
		if ((parameters->jpwl_hprot_MH > 0) || (parameters->jpwl_hprot_TPH[0] > 0)) {
			cp->epb_on = OPJ_TRUE;
			
			cp->hprot_MH = parameters->jpwl_hprot_MH;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				cp->hprot_TPH_tileno[i] = parameters->jpwl_hprot_TPH_tileno[i];
				cp->hprot_TPH[i] = parameters->jpwl_hprot_TPH[i];
			}
			/* if tile specs are not specified, copy MH specs */
			if (cp->hprot_TPH[0] == -1) {
				cp->hprot_TPH_tileno[0] = 0;
				cp->hprot_TPH[0] = parameters->jpwl_hprot_MH;
			}
			for (i = 0; i < JPWL_MAX_NO_PACKSPECS; i++) {
				cp->pprot_tileno[i] = parameters->jpwl_pprot_tileno[i];
				cp->pprot_packno[i] = parameters->jpwl_pprot_packno[i];
				cp->pprot[i] = parameters->jpwl_pprot[i];
			}
		}

		/* set ESD writing */
		if ((parameters->jpwl_sens_size == 1) || (parameters->jpwl_sens_size == 2)) {
			cp->esd_on = OPJ_TRUE;

			cp->sens_size = parameters->jpwl_sens_size;
			cp->sens_addr = parameters->jpwl_sens_addr;
			cp->sens_range = parameters->jpwl_sens_range;

			cp->sens_MH = parameters->jpwl_sens_MH;
			for (i = 0; i < JPWL_MAX_NO_TILESPECS; i++) {
				cp->sens_TPH_tileno[i] = parameters->jpwl_sens_TPH_tileno[i];
				cp->sens_TPH[i] = parameters->jpwl_sens_TPH[i];
			}
		}

		/* always set RED writing to false: we are at the encoder */
		cp->red_on = OPJ_FALSE;

	} else {
		cp->epc_on = OPJ_FALSE;
	}
#endif /* USE_JPWL */


	/* initialize the mutiple tiles */
	/* ---------------------------- */
	cp->tcps = (opj_tcp_t*) opj_calloc(cp->tw * cp->th, sizeof(opj_tcp_t));

	for (tileno = 0; tileno < cp->tw * cp->th; tileno++) {
		opj_tcp_t *tcp = &cp->tcps[tileno];
		tcp->numlayers = parameters->tcp_numlayers;
		for (j = 0; j < tcp->numlayers; j++) {
			if(cp->cinema){
				if (cp->fixed_quality) {
					tcp->distoratio[j] = parameters->tcp_distoratio[j];
				}
				tcp->rates[j] = parameters->tcp_rates[j];
			}else{
				if (cp->fixed_quality) {	/* add fixed_quality */
					tcp->distoratio[j] = parameters->tcp_distoratio[j];
				} else {
					tcp->rates[j] = parameters->tcp_rates[j];
				}
			}
		}
		tcp->csty = parameters->csty;
		tcp->prg = parameters->prog_order;
		tcp->mct = parameters->tcp_mct; 

		numpocs_tile = 0;
		tcp->POC = 0;
		if (parameters->numpocs) {
			/* initialisation of POC */
			tcp->POC = 1;
			for (i = 0; i < parameters->numpocs; i++) {
				if((tileno == parameters->POC[i].tile - 1) || (parameters->POC[i].tile == -1)) {
					opj_poc_t *tcp_poc = &tcp->pocs[numpocs_tile];
					tcp_poc->resno0		= parameters->POC[numpocs_tile].resno0;
					tcp_poc->compno0	= parameters->POC[numpocs_tile].compno0;
					tcp_poc->layno1		= parameters->POC[numpocs_tile].layno1;
					tcp_poc->resno1		= parameters->POC[numpocs_tile].resno1;
					tcp_poc->compno1	= parameters->POC[numpocs_tile].compno1;
					tcp_poc->prg1		= parameters->POC[numpocs_tile].prg1;
					tcp_poc->tile		= parameters->POC[numpocs_tile].tile;
					numpocs_tile++;
				}
			}
			tcp->numpocs = numpocs_tile -1 ;
		}else{ 
			tcp->numpocs = 0;
		}

		tcp->tccps = (opj_tccp_t*) opj_calloc(image->numcomps, sizeof(opj_tccp_t));

		for (i = 0; i < image->numcomps; i++) {
			opj_tccp_t *tccp = &tcp->tccps[i];
			tccp->csty = parameters->csty & 0x01;	/* 0 => one precinct || 1 => custom precinct  */
			tccp->numresolutions = parameters->numresolution;
			tccp->cblkw = int_floorlog2(parameters->cblockw_init);
			tccp->cblkh = int_floorlog2(parameters->cblockh_init);
			tccp->cblksty = parameters->mode;
			tccp->qmfbid = parameters->irreversible ? 0 : 1;
			tccp->qntsty = parameters->irreversible ? J2K_CCP_QNTSTY_SEQNT : J2K_CCP_QNTSTY_NOQNT;
			tccp->numgbits = 2;
			if (i == parameters->roi_compno) {
				tccp->roishift = parameters->roi_shift;
			} else {
				tccp->roishift = 0;
			}

			if(parameters->cp_cinema)
			{
				/*Precinct size for lowest frequency subband=128*/
				tccp->prcw[0] = 7;
				tccp->prch[0] = 7;
				/*Precinct size at all other resolutions = 256*/
				for (j = 1; j < tccp->numresolutions; j++) {
					tccp->prcw[j] = 8;
					tccp->prch[j] = 8;
				}
			}else{
				if (parameters->csty & J2K_CCP_CSTY_PRT) {
					int p = 0;
					for (j = tccp->numresolutions - 1; j >= 0; j--) {
						if (p < parameters->res_spec) {
							
							if (parameters->prcw_init[p] < 1) {
								tccp->prcw[j] = 1;
							} else {
								tccp->prcw[j] = int_floorlog2(parameters->prcw_init[p]);
							}
							
							if (parameters->prch_init[p] < 1) {
								tccp->prch[j] = 1;
							}else {
								tccp->prch[j] = int_floorlog2(parameters->prch_init[p]);
							}

						} else {
							int res_spec = parameters->res_spec;
							int size_prcw = parameters->prcw_init[res_spec - 1] >> (p - (res_spec - 1));
							int size_prch = parameters->prch_init[res_spec - 1] >> (p - (res_spec - 1));
							
							if (size_prcw < 1) {
								tccp->prcw[j] = 1;
							} else {
								tccp->prcw[j] = int_floorlog2(size_prcw);
							}
							
							if (size_prch < 1) {
								tccp->prch[j] = 1;
							} else {
								tccp->prch[j] = int_floorlog2(size_prch);
							}
						}
						p++;
						/*printf("\nsize precinct for level %d : %d,%d\n", j,tccp->prcw[j], tccp->prch[j]); */
					}	/*end for*/
				} else {
					for (j = 0; j < tccp->numresolutions; j++) {
						tccp->prcw[j] = 15;
						tccp->prch[j] = 15;
					}
				}
			}

			dwt_calc_explicit_stepsizes(tccp, image->comps[i].prec);
		}
	}
}